

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

double __thiscall
fasttext::Autotune::getMetricScore
          (Autotune *this,Meter *meter,metric_name *metricName,string *metricLabel)

{
  int32_t iVar1;
  runtime_error *prVar2;
  element_type *this_00;
  int *in_RDX;
  int32_t labelId;
  double score;
  undefined4 in_stack_ffffffffffffff58;
  int32_t in_stack_ffffffffffffff5c;
  Meter *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  Dictionary *in_stack_ffffffffffffff70;
  double local_28;
  
  if (*in_RDX == 1) {
    local_28 = Meter::f1Score((Meter *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                             );
  }
  else {
    if (*in_RDX != 2) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Unknown metric");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x177f84);
    FastText::getDictionary
              ((FastText *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x177fa0);
    iVar1 = Dictionary::getId(in_stack_ffffffffffffff70,
                              (string *)
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    std::shared_ptr<const_fasttext::Dictionary>::~shared_ptr
              ((shared_ptr<const_fasttext::Dictionary> *)0x177fc0);
    if (iVar1 == -1) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Unknown autotune metric label");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x178056);
    FastText::getDictionary
              ((FastText *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    this_00 = std::
              __shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x178072);
    Dictionary::nwords(this_00);
    std::shared_ptr<const_fasttext::Dictionary>::~shared_ptr
              ((shared_ptr<const_fasttext::Dictionary> *)0x178098);
    local_28 = Meter::f1Score(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  }
  return local_28;
}

Assistant:

double Autotune::getMetricScore(
    Meter& meter,
    const metric_name& metricName,
    const std::string& metricLabel) const {
  double score = 0.0;
  if (metricName == metric_name::f1score) {
    score = meter.f1Score();
  } else if (metricName == metric_name::labelf1score) {
    int32_t labelId = fastText_->getDictionary()->getId(metricLabel);
    if (labelId == -1) {
      throw std::runtime_error("Unknown autotune metric label");
    }
    labelId = labelId - fastText_->getDictionary()->nwords();
    score = meter.f1Score(labelId);
  } else {
    throw std::runtime_error("Unknown metric");
  }
  return score;
}